

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_timidity_mididevice.cpp
# Opt level: O1

FString __thiscall TimidityMIDIDevice::GetStats(TimidityMIDIDevice *this)

{
  FCriticalSection *this_00;
  byte bVar1;
  TimidityMIDIDevice *this_01;
  long lVar2;
  uint uVar3;
  long in_RSI;
  char *tail;
  long lVar4;
  long lVar5;
  FString dots;
  FString local_48;
  TimidityMIDIDevice *local_40;
  FCriticalSection *local_38;
  
  local_48.Chars = FString::NullString.Nothing;
  (this->super_SoftSynthMIDIDevice).super_MIDIDevice._vptr_MIDIDevice = (_func_int **)0x727dbc;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  this_00 = (FCriticalSection *)(in_RSI + 8);
  local_40 = this;
  FCriticalSection::Enter(this_00);
  lVar2 = *(long *)(in_RSI + 0x60);
  local_38 = this_00;
  if (*(int *)(lVar2 + 0x2c0) < 1) {
    uVar3 = 0;
  }
  else {
    lVar5 = 0;
    lVar4 = 0;
    uVar3 = 0;
    do {
      bVar1 = *(byte *)(*(long *)(lVar2 + 0x2a8) + lVar5);
      if ((bVar1 & 1) == 0) {
        FString::operator+=(&local_48,"\x1cT.");
      }
      else {
        tail = "\x1cH";
        if ((((bVar1 & 2) == 0) && (tail = "\x1cI", (bVar1 & 4) == 0)) &&
           (tail = "\x1cG", (bVar1 & 8) == 0)) {
          tail = "\x1cD";
        }
        FString::operator+=(&local_48,tail);
        uVar3 = uVar3 + 1;
        lVar2 = *(long *)(*(long *)(in_RSI + 0x60) + 0x2a8);
        if (*(char *)(lVar2 + 0x39 + lVar5) == '\0') {
          FString::operator+=(&local_48,"+");
        }
        else {
          FString::operator+=(&local_48,*(char *)(lVar2 + 0x38 + lVar5) + '0');
        }
      }
      lVar4 = lVar4 + 1;
      lVar2 = *(long *)(in_RSI + 0x60);
      lVar5 = lVar5 + 0x170;
    } while (lVar4 < *(int *)(lVar2 + 0x2c0));
  }
  this_01 = local_40;
  FCriticalSection::Leave(local_38);
  FString::Format((FString *)this_01,"\x1cK%3d/%3d ",(ulong)uVar3,
                  (ulong)*(uint *)(*(long *)(in_RSI + 0x60) + 0x2c0));
  FString::operator+=((FString *)this_01,&local_48);
  if (*(int *)(*(long *)(in_RSI + 0x60) + 0x2c4) != 0 ||
      *(int *)(*(long *)(in_RSI + 0x60) + 0x2c8) != 0) {
    FString::AppendFormat((FString *)this_01,"\x1cG %d/%d");
  }
  FString::~FString(&local_48);
  return (FString)(char *)this_01;
}

Assistant:

FString TimidityMIDIDevice::GetStats()
{
	FString dots;
	FString out;
	int i, used;

	CritSec.Enter();
	for (i = used = 0; i < Renderer->voices; ++i)
	{
		int status = Renderer->voice[i].status;

		if (!(status & Timidity::VOICE_RUNNING))
		{
			dots << TEXTCOLOR_PURPLE".";
		}
		else
		{
			used++;
			if (status & Timidity::VOICE_SUSTAINING)
			{
				dots << TEXTCOLOR_BLUE;
			}
			else if (status & Timidity::VOICE_RELEASING)
			{
				dots << TEXTCOLOR_ORANGE;
			}
			else if (status & Timidity::VOICE_STOPPING)
			{
				dots << TEXTCOLOR_RED;
			}
			else
			{
				dots << TEXTCOLOR_GREEN;
			}
			if (!Renderer->voice[i].eg1.env.bUpdating)
			{
				dots << "+";
			}
			else
			{
				dots << ('0' + Renderer->voice[i].eg1.gf1.stage);
			}
		}
	}
	CritSec.Leave();
	out.Format(TEXTCOLOR_YELLOW"%3d/%3d ", used, Renderer->voices);
	out += dots;
	if (Renderer->cut_notes | Renderer->lost_notes)
	{
		out.AppendFormat(TEXTCOLOR_RED" %d/%d", Renderer->cut_notes, Renderer->lost_notes);
	}
	return out;
}